

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterCase::getBufferVariableCount
          (AtomicCounterCase *this,int binding)

{
  Shader *pSVar1;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar2;
  int iVar3;
  int ndx;
  long lVar4;
  long lVar5;
  
  lVar5 = 0;
  lVar4 = 0;
  iVar3 = 0;
  while( true ) {
    pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
    pSVar1 = *(pvVar2->
              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)*(pointer *)
                      ((long)&(pSVar1->m_defaultBlock).variables.
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                      + 8) -
              *(long *)&(pSVar1->m_defaultBlock).variables.
                        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ._M_impl) / 0x60) <= lVar4) break;
    pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
    if (*(int *)(*(long *)&((*(pvVar2->
                              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).variables
                           .
                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ._M_impl + 0x20 + lVar5) == 0) {
      pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
      if (*(int *)(*(long *)&((*(pvVar2->
                                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                             variables.
                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                             ._M_impl + 0x28 + lVar5) == 0x54) {
        pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
        iVar3 = iVar3 + (uint)(*(int *)(*(long *)&((*(pvVar2->
                                                  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  m_defaultBlock).variables.
                                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                                  ._M_impl + 4 + lVar5) == binding);
      }
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x60;
  }
  return iVar3;
}

Assistant:

int AtomicCounterCase::getBufferVariableCount (int binding) const
{
	int numVars = 0;

	for (int ndx = 0; ndx < (int)m_program->getShaders()[0]->getDefaultBlock().variables.size(); ++ndx)
	{
		if (m_program->getShaders()[0]->getDefaultBlock().variables[ndx].varType.isBasicType() &&
			glu::isDataTypeAtomicCounter(m_program->getShaders()[0]->getDefaultBlock().variables[ndx].varType.getBasicType()) &&
			m_program->getShaders()[0]->getDefaultBlock().variables[ndx].layout.binding == binding)
			++numVars;
	}

	return numVars;
}